

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_ecc_edwards_decompress(void)

{
  mp_int *in_RAX;
  EdwardsCurve *ec;
  mp_int *yorig;
  EdwardsPoint *pEVar1;
  size_t sVar2;
  size_t i;
  ulong index;
  size_t p;
  ulong uVar3;
  mp_int *Y;
  
  Y = in_RAX;
  ec = ecurve();
  yorig = mp_new(0x90);
  pEVar1 = ecc_edwards_point_new_from_y(ec,yorig,0);
  if (pEVar1 != (EdwardsPoint *)0x0) {
    ecc_edwards_point_free(pEVar1);
  }
  uVar3 = 0;
  while( true ) {
    sVar2 = (*looplimit)(2);
    if (sVar2 <= uVar3) break;
    index = 0;
    while( true ) {
      sVar2 = (*looplimit)(5);
      if (sVar2 <= index) break;
      pEVar1 = epoint(ec,index);
      ecc_edwards_get_affine(pEVar1,(mp_int **)0x0,&Y);
      mp_copy_into(yorig,Y);
      mp_free(Y);
      ecc_edwards_point_free(pEVar1);
      log_start();
      pEVar1 = ecc_edwards_point_new_from_y(ec,yorig,(uint)uVar3);
      log_end();
      ecc_edwards_point_free(pEVar1);
      index = index + 1;
    }
    uVar3 = uVar3 + 1;
  }
  mp_free(yorig);
  ecc_edwards_curve_free(ec);
  return;
}

Assistant:

static void test_ecc_edwards_decompress(void)
{
    EdwardsCurve *ec = ecurve();

    /* As in the mp_modsqrt test, prime the lazy initialisation of the
     * ModsqrtContext */
    mp_int *y = mp_new(144);
    EdwardsPoint *a = ecc_edwards_point_new_from_y(ec, y, 0);
    if (a)                 /* don't care whether this one succeeded */
        ecc_edwards_point_free(a);

    for (size_t p = 0; p < looplimit(2); p++) {
        for (size_t i = 0; i < looplimit(5); i++) {
            EdwardsPoint *A = epoint(ec, i);
            mp_int *Y;
            ecc_edwards_get_affine(A, NULL, &Y);
            mp_copy_into(y, Y);
            mp_free(Y);
            ecc_edwards_point_free(A);

            log_start();
            EdwardsPoint *a = ecc_edwards_point_new_from_y(ec, y, p);
            log_end();

            ecc_edwards_point_free(a);
        }
    }
    mp_free(y);
    ecc_edwards_curve_free(ec);
}